

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

uint __thiscall
RigidBodyDynamics::ConstraintSet::AddLoopConstraint
          (ConstraintSet *this,uint idPredecessor,uint idSuccessor,SpatialTransform *XPredecessor,
          SpatialTransform *XSuccessor,SpatialVector *constraintAxisInPredecessor,
          bool enableBaumgarteStabilization,double stabilizationTimeConstant,char *constraintName,
          uint userDefinedId)

{
  uint *puVar1;
  ConstraintSet *pCVar2;
  SpatialTransform *pSVar3;
  uint i;
  long lVar4;
  ostream *poVar5;
  RBDLError *this_00;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  SpatialTransform *this_01;
  SpatialTransform *this_02;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar12;
  allocator_type local_291;
  ConstraintSet *local_290;
  uint local_288;
  uint local_284;
  SpatialTransform *local_280;
  SpatialTransform *local_278;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_270;
  double local_258;
  SpatialVector *local_250;
  string nameStr;
  Matrix<double,_3,_1,_0,_3,_1> local_200;
  string local_1e8;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_1c8 [8];
  _Bit_type *local_1c0;
  SpatialTransform frameErrorPre;
  
  uVar10 = *(long *)(this + 0x10) - *(long *)(this + 8) >> 2;
  local_290 = this + 0xf8;
  uVar7 = *(long *)(this + 0x100) - *(long *)(this + 0xf8);
  uVar9 = (uint)uVar10;
  if (uVar7 != 0) {
    lVar11 = (ulong)((int)(uVar7 >> 4) - 1) * 0x10;
    puVar1 = *(uint **)(*(long *)(*(long *)(this + 0xf8) + lVar11) + 0x38);
    if ((*puVar1 == idPredecessor) && (puVar1[1] == idSuccessor)) {
      this_02 = &frameErrorPre;
      local_288 = idPredecessor;
      local_284 = idSuccessor;
      local_280 = XPredecessor;
      local_278 = XSuccessor;
      local_258 = stabilizationTimeConstant;
      local_250 = constraintAxisInPredecessor;
      Math::SpatialTransform::SpatialTransform(this_02);
      this_01 = (SpatialTransform *)&nameStr;
      Math::SpatialTransform::SpatialTransform(this_01);
      pCVar2 = local_290;
      local_270.m_lhs = (LhsNested)&XPredecessor->r;
      local_270.m_rhs = (RhsNested)(*(long *)(*(long *)(*(long *)local_290 + lVar11) + 0x50) + 0x48)
      ;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                (&frameErrorPre.r.super_Vector3d,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)&local_270);
      local_270.m_rhs = *(RhsNested *)(*(long *)(*(long *)pCVar2 + lVar11) + 0x50);
      local_270.m_lhs = (LhsNested)local_280;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>>
                ((Matrix<double,_3,_3,_0,_3,_3> *)this_02,&local_270);
      pSVar3 = local_278;
      local_270.m_rhs = (RhsNested)(*(long *)(*(long *)(*(long *)pCVar2 + lVar11) + 0x50) + 0xa8);
      local_270.m_lhs = (LhsNested)&local_278->r;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                (&local_200,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)&local_270);
      local_270.m_rhs = (RhsNested)(*(long *)(*(long *)(*(long *)local_290 + lVar11) + 0x50) + 0x60)
      ;
      local_270.m_lhs = (LhsNested)pSVar3;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>>
                ((Matrix<double,_3,_3,_0,_3,_3> *)this_01,&local_270);
      bVar6 = true;
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        if ((2.220446049250313e-14 <
             ABS(*(double *)
                  ((long)frameErrorPre.r.super_Vector3d.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar4 * 8))) ||
           (2.220446049250313e-14 <
            ABS(local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[lVar4]))) {
          bVar6 = false;
        }
        for (lVar8 = 0; lVar8 != 0x48; lVar8 = lVar8 + 0x18) {
          if ((2.220446049250313e-14 <
               ABS(*(double *)
                    ((long)(this_02->E).super_Matrix3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array + lVar8))) ||
             (2.220446049250313e-14 <
              ABS(*(double *)
                   ((long)(this_01->E).super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + lVar8)))) {
            bVar6 = false;
          }
        }
        this_02 = (SpatialTransform *)
                  ((this_02->E).super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 1);
        this_01 = (SpatialTransform *)
                  ((this_01->E).super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 1);
      }
      XSuccessor = local_278;
      constraintAxisInPredecessor = local_250;
      XPredecessor = local_280;
      stabilizationTimeConstant = local_258;
      idSuccessor = local_284;
      idPredecessor = local_288;
      if ((bVar6) &&
         (((*(LoopConstraint **)(*(long *)local_290 + lVar11))->super_Constraint).id ==
          userDefinedId)) {
        LoopConstraint::appendConstraintAxis
                  (*(LoopConstraint **)(*(long *)local_290 + lVar11),local_250,true,true);
        goto LAB_001ffbba;
      }
    }
  }
  LoopConstraint::LoopConstraint
            ((LoopConstraint *)&frameErrorPre,idPredecessor,idSuccessor,XPredecessor,XSuccessor,
             constraintAxisInPredecessor,enableBaumgarteStabilization,stabilizationTimeConstant,
             constraintName,userDefinedId,true,true);
  std::make_shared<RigidBodyDynamics::LoopConstraint,RigidBodyDynamics::LoopConstraint&>
            ((LoopConstraint *)&nameStr);
  std::
  vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>>>
  ::emplace_back<std::shared_ptr<RigidBodyDynamics::LoopConstraint>>
            ((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>>>
              *)local_290,(shared_ptr<RigidBodyDynamics::LoopConstraint> *)&nameStr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&nameStr._M_string_length);
  lVar11 = *(long *)(this + 0xf8);
  lVar4 = (ulong)((int)((ulong)(*(long *)(this + 0x100) - lVar11) >> 4) - 1) * 0x10;
  *(uint *)(*(long *)(lVar11 + lVar4) + 0x34) = uVar9;
  std::
  vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
  ::emplace_back<std::shared_ptr<RigidBodyDynamics::LoopConstraint>&>
            ((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
              *)(this + 200),(shared_ptr<RigidBodyDynamics::LoopConstraint> *)(lVar11 + lVar4));
  LoopConstraint::~LoopConstraint((LoopConstraint *)&frameErrorPre);
LAB_001ffbba:
  frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0]._0_4_ = 1;
  std::vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>
  ::emplace_back<RigidBodyDynamics::ConstraintType>
            ((vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>
              *)(this + 8),(ConstraintType *)&frameErrorPre);
  nameStr._M_dataplus._M_p = (pointer)&nameStr.field_2;
  nameStr._M_string_length = 0;
  nameStr.field_2._M_local_buf[0] = '\0';
  if (constraintName != (char *)0x0) {
    std::__cxx11::string::assign((char *)&nameStr);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(this + 0x20),&nameStr);
  uVar7 = uVar10 + 1 & 0xffffffff;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x110),uVar7);
  uVar10 = uVar10 & 0xffffffff;
  *(undefined8 *)(*(long *)(this + 0x110) + uVar10 * 8) = 0;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x120),uVar7);
  *(undefined8 *)(*(long *)(this + 0x120) + uVar10 * 8) = 0;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x130),uVar7);
  *(undefined8 *)(*(long *)(this + 0x130) + uVar10 * 8) = 0;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x140),uVar7);
  *(undefined8 *)(*(long *)(this + 0x140) + uVar10 * 8) = 0;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x150),uVar7);
  *(undefined8 *)(*(long *)(this + 0x150) + uVar10 * 8) = 0;
  local_1c0 = (_Bit_type *)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_270,local_1c8);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)&frameErrorPre,uVar7,
             (value_type *)&local_270,&local_291);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::_M_move_assign
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(this + 0x600),&frameErrorPre);
  std::_Vector_base<Vector3_t,_std::allocator<Vector3_t>_>::~_Vector_base
            ((_Vector_base<Vector3_t,_std::allocator<Vector3_t>_> *)&frameErrorPre);
  if (nameStr._M_string_length != 0) {
    lVar11 = *(long *)(this + 200);
    lVar4 = *(long *)(this + 0xd0);
    std::__cxx11::string::string
              ((string *)&frameErrorPre,(string *)(*(long *)(this + 0x28) + -0x20));
    frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4]._0_4_ = (int)((ulong)(lVar4 - lVar11) >> 4) + -1;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                *)(this + 0x38),
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)&frameErrorPre);
    std::__cxx11::string::~string((string *)&frameErrorPre);
  }
  if (userDefinedId != 0xffffffff) {
    frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0]._4_4_ =
         (int)((ulong)(*(long *)(this + 0xd0) - *(long *)(this + 200)) >> 4) + -1;
    frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0]._0_4_ = userDefinedId;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
    ::_M_emplace_unique<std::pair<unsigned_int,unsigned_int>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                *)(this + 0x68),(pair<unsigned_int,_unsigned_int> *)&frameErrorPre);
  }
  frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0]._4_4_ =
       (int)((ulong)(*(long *)(this + 0xd0) - *(long *)(this + 200)) >> 4) + -1;
  frameErrorPre.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0]._0_4_ = uVar9;
  pVar12 = std::
           _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
           ::_M_emplace_unique<std::pair<unsigned_int,unsigned_int>>
                     ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                       *)(this + 0x98),(pair<unsigned_int,_unsigned_int> *)&frameErrorPre);
  if (pVar12.second == false) {
    std::__cxx11::stringstream::stringstream((stringstream *)&frameErrorPre);
    poVar5 = std::operator<<((ostream *)
                             ((long)frameErrorPre.E.super_Matrix3d.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                    m_storage.m_data.array + 0x10),
                             "Error: Constraint row entry in system is not unique.");
    poVar5 = std::operator<<(poVar5,
                             " (This should not be possible: contact the maintainer of this code.)")
    ;
    std::endl<char,std::char_traits<char>>(poVar5);
    this_00 = (RBDLError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    Errors::RBDLError::RBDLError(this_00,&local_1e8);
    __cxa_throw(this_00,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  std::__cxx11::string::~string((string *)&nameStr);
  return uVar9;
}

Assistant:

unsigned int ConstraintSet::AddLoopConstraint (
  unsigned int idPredecessor,
  unsigned int idSuccessor,
  const Math::SpatialTransform &XPredecessor,
  const Math::SpatialTransform &XSuccessor,
  const Math::SpatialVector &constraintAxisInPredecessor,
  bool enableBaumgarteStabilization,
  double stabilizationTimeConstant,
  const char *constraintName,
  unsigned int userDefinedId)
{
  assert (bound == false);


  unsigned int insertAtRowInG = unsigned(size());
  unsigned int rowsInG = insertAtRowInG+1;

  double tol = std::numeric_limits<double>::epsilon()*100.;
  bool constraintAppended = false;
  unsigned int idx = unsigned(loopConstraints.size());

  if(loopConstraints.size() > 0) {
    idx = idx-1;
    if(loopConstraints[idx]->getBodyIds()[0] == idPredecessor &&
        loopConstraints[idx]->getBodyIds()[1] == idSuccessor) {

      bool framesNumericallyIdentical=true;
      SpatialTransform frameErrorPre, frameErrorSuc;

      frameErrorPre.r=XPredecessor.r-loopConstraints[idx]->getBodyFrames()[0].r;
      frameErrorPre.E=XPredecessor.E-loopConstraints[idx]->getBodyFrames()[0].E;

      frameErrorSuc.r=XSuccessor.r  -loopConstraints[idx]->getBodyFrames()[1].r;
      frameErrorSuc.E=XSuccessor.E  -loopConstraints[idx]->getBodyFrames()[1].E;

      //Using this awkward element by element comparison to maintain
      //compatibility with SimpleMath.
#ifndef RBDL_USE_CASADI_MATH
      for(unsigned int i=0; i<frameErrorPre.r.size(); ++i) {
        if(fabs(frameErrorPre.r[i]) > tol || fabs(frameErrorSuc.r[i]) > tol) {
          framesNumericallyIdentical=false;
        }
        for(unsigned int j=0; j<frameErrorPre.E.cols(); ++j) {
          if(fabs(frameErrorPre.E(i,j))>tol || fabs(frameErrorSuc.E(i,j))>tol) {
            framesNumericallyIdentical=false;
          }
        }
      }
#endif

      if(framesNumericallyIdentical
         && loopConstraints[idx]->getUserDefinedId() == userDefinedId) {
        constraintAppended = true;
        loopConstraints[idx]->appendConstraintAxis(constraintAxisInPredecessor);
      }
    }
  }

  if(constraintAppended==false) {

    LoopConstraint loopCon( idPredecessor, idSuccessor,
                            XPredecessor,  XSuccessor,
                            constraintAxisInPredecessor,
                            enableBaumgarteStabilization,
                            stabilizationTimeConstant,
                            constraintName,
                            userDefinedId);

    loopConstraints.push_back(std::make_shared<LoopConstraint>(loopCon));
    idx = unsigned(loopConstraints.size()-1);
    loopConstraints[idx]->addToConstraintSet(insertAtRowInG);
    constraints.emplace_back(loopConstraints[idx]);
  }

  constraintType.push_back(ConstraintTypeLoop);

  //Update all of the struct arrays so that they have the correct number
  //of elements
  std::string nameStr;
  if (constraintName != NULL) {
    nameStr = constraintName;
  }

  name.push_back (nameStr);


  err.conservativeResize(rowsInG);
  err[insertAtRowInG] = 0.;
  errd.conservativeResize(rowsInG);
  errd[insertAtRowInG] = 0.;

  force.conservativeResize (rowsInG);
  force[insertAtRowInG] = 0.;

  impulse.conservativeResize (rowsInG);
  impulse[insertAtRowInG] = 0.;

  v_plus.conservativeResize (rowsInG);
  v_plus[insertAtRowInG] = 0.;

  d_multdof3_u = std::vector<Math::Vector3d>(rowsInG, Math::Vector3d::Zero());

  //Set up access maps
  if(nameStr.size() > 0) {
    std::pair< std::map<std::string, unsigned int>::iterator, bool > iter;
    iter = nameGroupMap.insert(std::pair<std::string, unsigned int>(
                                 name[name.size()-1],
                                 unsigned(constraints.size()-1)));
    //if(iter.second == false){
    //  std::cerr << "Error: optional name is not unique."
    //            << std::endl;
    //  assert(0);
    //  abort();
    //}

  }

  if(userDefinedId < std::numeric_limits<unsigned int>::max()) {
    std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
    iter =userDefinedIdGroupMap.insert( std::pair<unsigned int, unsigned int>(
                                          userDefinedId,
                                          unsigned(constraints.size()-1)));
    //if(iter.second == false){
    //  std::cerr << "Error: optional userDefinedId is not unique."
    //            << std::endl;
    //  assert(0);
    //  abort();
    //}
  }

  std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
  iter = idGroupMap.insert(std::pair<unsigned int, unsigned int>(
                             unsigned(rowsInG-1),
                             unsigned(constraints.size()-1)));
  if(iter.second == false) {
    std::stringstream errormsg;
    errormsg << "Error: Constraint row entry in system is not unique."
             << " (This should not be possible: contact the "
             "maintainer of this code.)"
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  return rowsInG-1;
}